

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

CordRepBtree * absl::cord_internal::CordRepBtree::Rebuild(CordRepBtree *tree)

{
  CordRepBtree *pCVar1;
  CordRepBtree *pCVar2;
  CordRepBtree *(*__range2) [13];
  long lVar3;
  CordRepBtree *stack [13];
  
  lVar3 = 0;
  pCVar1 = New(0);
  stack[1] = (CordRepBtree *)0x0;
  stack[10] = (CordRepBtree *)0x0;
  stack[0xb] = (CordRepBtree *)0x0;
  stack[8] = (CordRepBtree *)0x0;
  stack[9] = (CordRepBtree *)0x0;
  stack[6] = (CordRepBtree *)0x0;
  stack[7] = (CordRepBtree *)0x0;
  stack[4] = (CordRepBtree *)0x0;
  stack[5] = (CordRepBtree *)0x0;
  stack[2] = (CordRepBtree *)0x0;
  stack[3] = (CordRepBtree *)0x0;
  stack[0xc] = (CordRepBtree *)0x0;
  stack[0] = pCVar1;
  Rebuild(stack,tree,true);
  do {
    if (lVar3 == 0x68) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                    ,0x48a,
                    "static CordRepBtree *absl::cord_internal::CordRepBtree::Rebuild(CordRepBtree *)"
                   );
    }
    pCVar2 = pCVar1;
    pCVar1 = *(CordRepBtree **)((long)stack + lVar3);
    lVar3 = lVar3 + 8;
  } while (pCVar1 != (CordRepBtree *)0x0);
  return pCVar2;
}

Assistant:

CordRepBtree* CordRepBtree::Rebuild(CordRepBtree* tree) {
  // Set up initial stack with empty leaf node.
  CordRepBtree* node = CordRepBtree::New();
  CordRepBtree* stack[CordRepBtree::kMaxDepth + 1] = {node};

  // Recursively build the tree, consuming the input tree.
  Rebuild(stack, tree, /* consume reference */ true);

  // Return top most node
  for (CordRepBtree* parent : stack) {
    if (parent == nullptr) return node;
    node = parent;
  }

  // Unreachable
  assert(false);
  return nullptr;
}